

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O1

void ga_dadd_patch_(DoublePrecision *alpha,Integer *g_a,Integer *ailo,Integer *aihi,Integer *ajlo,
                   Integer *ajhi,DoublePrecision *beta,Integer *g_b,Integer *bilo,Integer *bihi,
                   Integer *bjlo,Integer *bjhi,Integer *g_c,Integer *cilo,Integer *cihi,
                   Integer *cjlo,Integer *cjhi)

{
  Integer ctype;
  Integer btype;
  Integer atype;
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  pnga_inquire_type(*g_c,&ctype);
  if (((atype != btype) || (atype != 0x3ec)) || (ctype != 0x3ec)) {
    pnga_error(" wrong types ",0);
  }
  sga_add_patch(alpha,*g_a,ailo,aihi,ajlo,ajhi,beta,*g_b,bilo,bihi,bjlo,bjhi,*g_c,cilo,cihi,cjlo,
                cjhi);
  return;
}

Assistant:

void FATR ga_dadd_patch_(DoublePrecision *alpha, Integer *g_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, DoublePrecision *beta, Integer *g_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, Integer *g_c, Integer *cilo, Integer *cihi, Integer *cjlo, Integer *cjhi)
{
    Integer atype, btype, ctype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    pnga_inquire_type(*g_c, &ctype);
    if (atype != btype || atype != ctype || atype != C_DBL)
        pnga_error(" wrong types ", 0L);
    sga_add_patch(alpha, *g_a, ailo, aihi, ajlo, ajhi, beta, *g_b, bilo, bihi, bjlo, bjhi, *g_c, cilo, cihi, cjlo, cjhi);
}